

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_7,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in0;
  Vector<float,_2> local_80;
  Matrix<float,_4,_2> local_78;
  Vector<float,_3> local_50;
  tcu local_40 [8];
  float local_38;
  float local_34;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    tcu::Matrix<float,_4,_2>::Matrix(&local_78);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    tcu::Matrix<float,_4,_2>::Matrix(&local_78,(float *)s_constInMat2x4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_80.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_80,(Vector<float,_2> *)(s_constInVec2 + 8));
  }
  tcu::operator*(local_40,&local_78,&local_80);
  local_50.m_data[2] = local_38 + local_34;
  local_50.m_data._0_8_ = local_40;
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_50);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}